

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::setCategoryWeights
          (BeagleCPUImpl<double,_1,_1> *this,int categoryWeightsIndex,double *inCategoryWeights)

{
  void *pvVar1;
  double *in_RDX;
  int in_ESI;
  double *in_RDI;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 6) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)((long)in_RDI[0x14] + (long)in_ESI * 8) == 0) {
      pvVar1 = malloc((long)*(int *)((long)in_RDI + 0x34) << 3);
      *(void **)((long)in_RDI[0x14] + (long)in_ESI * 8) = pvVar1;
      if (*(long *)((long)in_RDI[0x14] + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    beagleMemCpy<double>(in_RDX,in_RDI,0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryWeights(int categoryWeightsIndex,
                                                 const double* inCategoryWeights) {
    if (categoryWeightsIndex < 0 || categoryWeightsIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryWeights[categoryWeightsIndex] == NULL) {
        gCategoryWeights[categoryWeightsIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kCategoryCount);
        if (gCategoryWeights[categoryWeightsIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gCategoryWeights[categoryWeightsIndex], inCategoryWeights, kCategoryCount);

    return BEAGLE_SUCCESS;
}